

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O3

void __thiscall
TopologicalSortTest_TwoChains_Test::TestBody(TopologicalSortTest_TwoChains_Test *this)

{
  iterator __position;
  void *pvVar1;
  long lVar2;
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_05;
  uint local_2e8 [6];
  undefined1 *puStack_2d0;
  uint local_2c8 [10];
  undefined1 local_2a0 [8];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  results;
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  expected;
  void *local_238;
  long local_228;
  void *local_220;
  long local_210;
  void *local_208;
  long local_1f8;
  void *local_1e8;
  long local_1d8;
  TopologicalOrdersImpl<std::monostate> local_1d0;
  undefined1 local_160 [8];
  TopologicalOrders orders;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  Message local_48;
  undefined1 *puStack_40;
  AssertHelper local_38;
  undefined8 uStack_30;
  allocator_type local_28;
  allocator_type local_27;
  allocator_type local_26;
  allocator_type local_25;
  allocator_type local_24;
  allocator_type local_23;
  less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_22;
  allocator_type local_21;
  
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x60);
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  ((local_60.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_60.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_60.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  orders.selectors.
  super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  local_60.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (local_60.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(iterator)0x0,
             (uint *)&orders.selectors.
                      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __position._M_current =
       local_60.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  orders.selectors.
  super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
  if (__position._M_current ==
      local_60.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (local_60.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,__position,
               (uint *)&orders.selectors.
                        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    *__position._M_current = 3;
    local_60.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_160,&local_60);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count,local_160);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            (&local_1d0,(TopologicalOrdersImpl<std::monostate> *)local_160);
  std::
  set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::set<wasm::TopologicalOrdersImpl<std::monostate>>
            ((set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)local_2a0,
             (TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1d0);
  if (local_1d0.selectors.
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.selectors.
                    super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d0.choiceHeap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.choiceHeap.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d0.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d0.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.indegrees.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8 != (void *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,local_1f8 - (long)local_208);
  }
  if (local_220 != (void *)0x0) {
    operator_delete(local_220,local_210 - (long)local_220);
  }
  if (local_238 != (void *)0x0) {
    operator_delete(local_238,local_228 - (long)local_238);
  }
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x100000000;
  puStack_40 = &DAT_300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &orders.selectors.
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,&local_28);
  local_38.data_ = (AssertHelperData *)&DAT_100000000;
  uStack_30 = 0x200000003;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d8,__l_00,&local_27);
  local_2e8[0] = 0;
  local_2e8[1] = 2;
  local_2e8[2] = 1;
  local_2e8[3] = 3;
  __l_01._M_len = 4;
  __l_01._M_array = local_2e8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0,__l_01,&local_26);
  local_2e8[4] = 1;
  local_2e8[5] = 0;
  puStack_2d0 = &DAT_300000002;
  __l_02._M_len = 4;
  __l_02._M_array = local_2e8 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,__l_02,&local_25);
  local_2c8[0] = 1;
  local_2c8[1] = 0;
  local_2c8[2] = 3;
  local_2c8[3] = 2;
  __l_03._M_len = 4;
  __l_03._M_array = local_2c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,__l_03,&local_24);
  local_2c8[4] = 1;
  local_2c8[5] = 3;
  local_2c8[6] = 0;
  local_2c8[7] = 2;
  __l_04._M_len = 4;
  __l_04._M_array = local_2c8 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,__l_04,&local_23);
  __l_05._M_len = 6;
  __l_05._M_array =
       (iterator)
       &orders.selectors.
        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count,__l_05,&local_22,&local_21);
  lVar2 = 0x90;
  do {
    pvVar1 = *(void **)((long)local_e8 + lVar2 + -0x20);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_e8 + lVar2 + -0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0);
  testing::internal::
  CmpHelperEQ<std::set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
            ((internal *)
             &orders.selectors.
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"results","expected",
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_2a0,
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((char)orders.selectors.
            super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message(&local_48);
    if (local_e8[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e8[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_e8[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8,local_e8[0]);
  }
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::_Identity<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_2a0);
  if (orders._80_8_ != 0) {
    operator_delete((void *)orders._80_8_,
                    (long)orders.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_finish - orders._80_8_);
  }
  if (orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)orders.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (orders.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(orders.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)orders.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (orders.graph != (Graph_conflict *)0x0) {
    operator_delete(orders.graph,
                    (long)orders.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)orders.graph);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

TEST(TopologicalSortTest, TwoChains) {
  Graph graph(4);
  graph[0].push_back(2);
  graph[1].push_back(3);
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{
    {0, 1, 2, 3},
    {0, 1, 3, 2},
    {0, 2, 1, 3},
    {1, 0, 2, 3},
    {1, 0, 3, 2},
    {1, 3, 0, 2},
  };
  EXPECT_EQ(results, expected);
}